

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O0

void AddOneKey(Keygroup *keygroup,PClassActor *mi,FScanner *sc)

{
  bool bVar1;
  undefined1 uVar2;
  AActor *pAVar3;
  undefined1 local_30 [8];
  OneKey k;
  FScanner *sc_local;
  PClassActor *mi_local;
  Keygroup *keygroup_local;
  
  k._8_8_ = sc;
  if (mi == (PClassActor *)0x0) {
    FScanner::ScriptError(sc,"Unknown item \'%s\'",sc->String);
  }
  else {
    bVar1 = PClass::IsDescendantOf(&mi->super_PClass,AInventory::RegistrationInfo.MyClass);
    if (bVar1) {
      k.key._0_4_ = 1;
      local_30 = (undefined1  [8])mi;
      TArray<OneKey,_OneKey>::Push(&keygroup->anykeylist,(OneKey *)local_30);
      bVar1 = PClass::IsDescendantOf(&mi->super_PClass,AKey::RegistrationInfo.MyClass);
      if (((bVar1) && ((ignorekey & 1U) == 0)) &&
         (pAVar3 = GetDefaultByType(&mi->super_PClass),
         *(char *)((long)&pAVar3[1].snext + 4) == '\0')) {
        currentnumber = currentnumber + 1;
        uVar2 = (undefined1)currentnumber;
        pAVar3 = GetDefaultByType(&mi->super_PClass);
        *(undefined1 *)((long)&pAVar3[1].snext + 4) = uVar2;
      }
    }
    else {
      FScanner::ScriptError
                ((FScanner *)k._8_8_,"\'%s\' is not an inventory item",*(undefined8 *)k._8_8_);
    }
  }
  return;
}

Assistant:

static void AddOneKey(Keygroup *keygroup, PClassActor *mi, FScanner &sc)
{
	if (mi)
	{
		// Any inventory item can be used to unlock a door
		if (mi->IsDescendantOf(RUNTIME_CLASS(AInventory)))
		{
			OneKey k = {mi,1};
			keygroup->anykeylist.Push (k);

			//... but only keys get key numbers!
			if (mi->IsDescendantOf(RUNTIME_CLASS(AKey)))
			{
				if (!ignorekey &&
					static_cast<AKey*>(GetDefaultByType(mi))->KeyNumber == 0)
				{
					static_cast<AKey*>(GetDefaultByType(mi))->KeyNumber=++currentnumber;
				}
			}
		}
		else
		{
			sc.ScriptError("'%s' is not an inventory item", sc.String);
		}
	}
	else
	{
		sc.ScriptError("Unknown item '%s'", sc.String);
	}
}